

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::Postprocess_CollectMetadata
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiNode *pSceneNode)

{
  uint uVar1;
  bool bVar2;
  DeadlyImportError *pDVar3;
  size_type sVar4;
  aiMetadata *paVar5;
  reference ppCVar6;
  CX3DImporter_NodeElement *pCVar7;
  reference pdVar8;
  reference value;
  reference value_00;
  char *__s;
  iterator iVar9;
  reference rVar10;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_520;
  string local_518;
  undefined1 local_4f4 [8];
  aiString tstr;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e0;
  float local_d4;
  _Bit_type *local_d0;
  uint local_c8;
  _Bit_iterator local_c0;
  reference local_b0;
  CX3DImporter_NodeElement *local_a0;
  CX3DImporter_NodeElement_Meta *cur_meta;
  _List_const_iterator<CX3DImporter_NodeElement_*> local_90;
  iterator local_88;
  _List_const_iterator<CX3DImporter_NodeElement_*> local_80;
  const_iterator it;
  string local_70;
  long local_40;
  size_t meta_idx;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> meta_list;
  aiNode *pSceneNode_local;
  CX3DImporter_NodeElement *pNodeElement_local;
  X3DImporter *this_local;
  
  meta_list.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = (size_t)pSceneNode;
  std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::list
            ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
             &meta_idx);
  PostprocessHelper_CollectMetadata
            (this,pNodeElement,
             (list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
             &meta_idx);
  bVar2 = std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::empty
                    ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      *)&meta_idx);
  if (!bVar2) {
    if (*(long *)(meta_list.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node._M_size + 0x470) != 0) {
      it._M_node._6_1_ = 1;
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "Postprocess. MetaData member in node are not nullptr. Something went wrong.",
                 (allocator<char> *)((long)&it._M_node + 7));
      DeadlyImportError::DeadlyImportError(pDVar3,&local_70);
      it._M_node._6_1_ = 0;
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sVar4 = std::__cxx11::
            list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::size
                      ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        *)&meta_idx);
    paVar5 = aiMetadata::Alloc((uint)sVar4);
    *(aiMetadata **)
     (meta_list.
      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
      _M_impl._M_node._M_size + 0x470) = paVar5;
    local_40 = 0;
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
         ::begin((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
                 &meta_idx);
    std::_List_const_iterator<CX3DImporter_NodeElement_*>::_List_const_iterator(&local_80,&local_88)
    ;
    while( true ) {
      cur_meta = (CX3DImporter_NodeElement_Meta *)
                 std::__cxx11::
                 list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                           ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                             *)&meta_idx);
      std::_List_const_iterator<CX3DImporter_NodeElement_*>::_List_const_iterator
                (&local_90,(iterator *)&cur_meta);
      bVar2 = std::operator!=(&local_80,&local_90);
      if (!bVar2) break;
      ppCVar6 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_80);
      local_a0 = *ppCVar6;
      ppCVar6 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_80);
      if ((*ppCVar6)->Type == ENET_MetaBoolean) {
        sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)
                           &local_a0[1].Child.
                            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                            ._M_impl._M_node.super__List_node_base._M_prev);
        if (sVar4 != 0) {
          paVar5 = *(aiMetadata **)
                    (meta_list.
                     super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                     ._M_impl._M_node._M_size + 0x470);
          uVar1 = (uint)local_40;
          pCVar7 = local_a0 + 1;
          iVar9 = std::vector<bool,_std::allocator<bool>_>::begin
                            ((vector<bool,_std::allocator<bool>_> *)
                             &local_a0[1].Child.
                              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              ._M_impl._M_node.super__List_node_base._M_prev);
          local_d0 = iVar9.super__Bit_iterator_base._M_p;
          local_c8 = iVar9.super__Bit_iterator_base._M_offset;
          local_c0.super__Bit_iterator_base._M_p = local_d0;
          local_c0.super__Bit_iterator_base._M_offset = local_c8;
          rVar10 = std::_Bit_iterator::operator*(&local_c0);
          local_b0 = rVar10;
          aiMetadata::Set<std::_Bit_reference>(paVar5,uVar1,(string *)pCVar7,&local_b0);
        }
      }
      else {
        ppCVar6 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_80);
        if ((*ppCVar6)->Type == ENET_MetaDouble) {
          sVar4 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)
                             &local_a0[1].Child.
                              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              ._M_impl._M_node.super__List_node_base._M_prev);
          if (sVar4 != 0) {
            paVar5 = *(aiMetadata **)
                      (meta_list.
                       super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       ._M_impl._M_node._M_size + 0x470);
            uVar1 = (uint)local_40;
            pCVar7 = local_a0 + 1;
            local_e0._M_current =
                 (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)
                            &local_a0[1].Child.
                             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                             ._M_impl._M_node.super__List_node_base._M_prev);
            pdVar8 = __gnu_cxx::
                     __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                     operator*(&local_e0);
            local_d4 = (float)*pdVar8;
            aiMetadata::Set<float>(paVar5,uVar1,(string *)pCVar7,&local_d4);
          }
        }
        else {
          ppCVar6 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_80);
          if ((*ppCVar6)->Type == ENET_MetaFloat) {
            sVar4 = std::vector<float,_std::allocator<float>_>::size
                              ((vector<float,_std::allocator<float>_> *)
                               &local_a0[1].Child.
                                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                ._M_impl._M_node.super__List_node_base._M_prev);
            if (sVar4 != 0) {
              paVar5 = *(aiMetadata **)
                        (meta_list.
                         super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         ._M_impl._M_node._M_size + 0x470);
              uVar1 = (uint)local_40;
              pCVar7 = local_a0 + 1;
              local_e8._M_current =
                   (float *)std::vector<float,_std::allocator<float>_>::begin
                                      ((vector<float,_std::allocator<float>_> *)
                                       &local_a0[1].Child.
                                        super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev);
              value = __gnu_cxx::
                      __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                      operator*(&local_e8);
              aiMetadata::Set<float>(paVar5,uVar1,(string *)pCVar7,value);
            }
          }
          else {
            ppCVar6 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_80);
            if ((*ppCVar6)->Type == ENET_MetaInteger) {
              sVar4 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)
                                 &local_a0[1].Child.
                                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev);
              if (sVar4 != 0) {
                paVar5 = *(aiMetadata **)
                          (meta_list.
                           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                           ._M_impl._M_node._M_size + 0x470);
                uVar1 = (uint)local_40;
                pCVar7 = local_a0 + 1;
                tstr.data._1016_8_ =
                     std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)
                                &local_a0[1].Child.
                                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev);
                value_00 = __gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)(tstr.data + 0x3f8));
                aiMetadata::Set<int>(paVar5,uVar1,(string *)pCVar7,value_00);
              }
            }
            else {
              ppCVar6 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_80);
              if ((*ppCVar6)->Type != ENET_MetaString) {
                pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_548,"Postprocess. Unknown metadata type.",&local_549);
                DeadlyImportError::DeadlyImportError(pDVar3,&local_548);
                __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,
                            DeadlyImportError::~DeadlyImportError);
              }
              sVar4 = std::__cxx11::
                      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a0[1].Child.
                                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev);
              if (sVar4 != 0) {
                local_520._M_node =
                     (_List_node_base *)
                     std::__cxx11::
                     list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a0[1].Child.
                                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev);
                std::
                _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator->(&local_520);
                __s = (char *)std::__cxx11::string::data();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_518,__s,&local_521);
                aiString::aiString((aiString *)local_4f4,&local_518);
                std::__cxx11::string::~string((string *)&local_518);
                std::allocator<char>::~allocator(&local_521);
                aiMetadata::Set<aiString>
                          (*(aiMetadata **)
                            (meta_list.
                             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                             ._M_impl._M_node._M_size + 0x470),(uint)local_40,
                           (string *)(local_a0 + 1),(aiString *)local_4f4);
              }
            }
          }
        }
      }
      std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator++(&local_80);
      local_40 = local_40 + 1;
    }
  }
  std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::~list
            ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
             &meta_idx);
  return;
}

Assistant:

void X3DImporter::Postprocess_CollectMetadata(const CX3DImporter_NodeElement& pNodeElement, aiNode& pSceneNode) const
{
    std::list<CX3DImporter_NodeElement*> meta_list;
    size_t meta_idx;

	PostprocessHelper_CollectMetadata(pNodeElement, meta_list);// find metadata in current node element.
	if ( !meta_list.empty() )
	{
        if ( pSceneNode.mMetaData != nullptr ) {
            throw DeadlyImportError( "Postprocess. MetaData member in node are not nullptr. Something went wrong." );
        }

		// copy collected metadata to output node.
        pSceneNode.mMetaData = aiMetadata::Alloc( static_cast<unsigned int>(meta_list.size()) );
		meta_idx = 0;
		for(std::list<CX3DImporter_NodeElement*>::const_iterator it = meta_list.begin(); it != meta_list.end(); ++it, ++meta_idx)
		{
			CX3DImporter_NodeElement_Meta* cur_meta = (CX3DImporter_NodeElement_Meta*)*it;

			// due to limitations we can add only first element of value list.
			// Add an element according to its type.
			if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaBoolean)
			{
				if(((CX3DImporter_NodeElement_MetaBoolean*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaBoolean*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaDouble)
			{
				if(((CX3DImporter_NodeElement_MetaDouble*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, (float)*(((CX3DImporter_NodeElement_MetaDouble*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaFloat)
			{
				if(((CX3DImporter_NodeElement_MetaFloat*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaFloat*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaInteger)
			{
				if(((CX3DImporter_NodeElement_MetaInteger*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaInteger*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaString)
			{
				if(((CX3DImporter_NodeElement_MetaString*)cur_meta)->Value.size() > 0)
				{
					aiString tstr(((CX3DImporter_NodeElement_MetaString*)cur_meta)->Value.begin()->data());

					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, tstr);
				}
			}
			else
			{
				throw DeadlyImportError("Postprocess. Unknown metadata type.");
			}// if((*it)->Type == CX3DImporter_NodeElement::ENET_Meta*) else
		}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = meta_list.begin(); it != meta_list.end(); it++)
	}// if( !meta_list.empty() )
}